

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O1

void __thiscall
antlr::BaseAST::doWorkForFindAll
          (BaseAST *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *v,RefAST *target,bool partialMatch)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  AST *pAVar4;
  BaseAST *this_00;
  ASTRefCount<antlr::AST> *this_01;
  bool bVar5;
  RefAST sibling;
  value_type local_70;
  ASTRefCount<antlr::AST> local_68;
  ASTRefCount<antlr::AST> local_60;
  ASTRefCount<antlr::AST> local_58;
  ASTRefCount<antlr::AST> local_50;
  uint local_44;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *local_40
  ;
  ASTRefCount<antlr::AST> local_38;
  
  local_40 = v;
  local_70.ref = ASTRef::getRef(&this->super_AST);
  bVar5 = local_70.ref == (ASTRef *)0x0;
  if (!bVar5) {
    local_44 = (uint)partialMatch;
    do {
      if ((local_70.ref)->ptr == (AST *)0x0) break;
      if (partialMatch) {
        if (bVar5) {
          pAVar4 = (AST *)0x0;
        }
        else {
          pAVar4 = (local_70.ref)->ptr;
        }
        local_50.ref = target->ref;
        if (local_50.ref == (ASTRef *)0x0) {
          local_50.ref = (ASTRef *)0x0;
        }
        else {
          (local_50.ref)->count = (local_50.ref)->count + 1;
        }
        iVar1 = (*pAVar4->_vptr_AST[8])(pAVar4,&local_50);
        bVar2 = (byte)iVar1;
        if ((bVar2 | partialMatch) == 0) goto LAB_001f89f0;
        bVar5 = false;
        bVar3 = bVar2 | partialMatch;
      }
      else {
LAB_001f89f0:
        if (local_70.ref == (ASTRef *)0x0) {
          pAVar4 = (AST *)0x0;
        }
        else {
          pAVar4 = (local_70.ref)->ptr;
        }
        local_58.ref = target->ref;
        if (local_58.ref == (ASTRef *)0x0) {
          local_58.ref = (ASTRef *)0x0;
        }
        else {
          (local_58.ref)->count = (local_58.ref)->count + 1;
        }
        iVar1 = (*pAVar4->_vptr_AST[7])(pAVar4,&local_58);
        bVar2 = (byte)iVar1;
        bVar5 = true;
        bVar3 = partialMatch;
      }
      if (bVar5) {
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_58);
      }
      if (bVar3 != 0) {
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_50);
      }
      if (bVar2 != 0) {
        std::
        vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
        push_back(local_40,&local_70);
      }
      (*(local_70.ref)->ptr->_vptr_AST[0xd])(&local_60);
      this_01 = &local_60;
      if (local_60.ref == (ASTRef *)0x0) {
LAB_001f8b09:
        ASTRefCount<antlr::AST>::~ASTRefCount(this_01);
      }
      else {
        pAVar4 = (local_60.ref)->ptr;
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
        if (pAVar4 != (AST *)0x0) {
          (*(local_70.ref)->ptr->_vptr_AST[0xd])();
          if (local_68.ref == (ASTRef *)0x0) {
            pAVar4 = (AST *)0x0;
          }
          else {
            pAVar4 = (local_68.ref)->ptr;
          }
          if (pAVar4 == (AST *)0x0) {
            local_60.ref = (ASTRef *)0x0;
          }
          else {
            local_60.ref = ASTRef::getRef(pAVar4);
          }
          if (local_60.ref == (ASTRef *)0x0) {
            this_00 = (BaseAST *)0x0;
          }
          else {
            this_00 = (BaseAST *)(local_60.ref)->ptr;
          }
          local_38.ref = target->ref;
          if (local_38.ref == (ASTRef *)0x0) {
            local_38.ref = (ASTRef *)0x0;
          }
          else {
            (local_38.ref)->count = (local_38.ref)->count + 1;
          }
          doWorkForFindAll(this_00,local_40,&local_38,SUB41(local_44,0));
          ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
          ASTRefCount<antlr::BaseAST>::~ASTRefCount((ASTRefCount<antlr::BaseAST> *)&local_60);
          this_01 = &local_68;
          goto LAB_001f8b09;
        }
      }
      (*(local_70.ref)->ptr->_vptr_AST[0xe])(&local_60);
      ASTRefCount<antlr::AST>::operator=(&local_70,&local_60);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
      bVar5 = local_70.ref == (ASTRef *)0x0;
    } while (!bVar5);
  }
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_70);
  return;
}

Assistant:

void BaseAST::doWorkForFindAll(
		ANTLR_USE_NAMESPACE(std)vector<RefAST>& v,
		RefAST target,bool partialMatch)
{
	// Start walking sibling lists, looking for matches.
	for (RefAST sibling=this;
			sibling;
			sibling=sibling->getNextSibling())
	{
		if ( (partialMatch && sibling->equalsTreePartial(target)) ||
				(!partialMatch && sibling->equalsTree(target)) ) {
			v.push_back(sibling);
		}
		// regardless of match or not, check any children for matches
		if ( sibling->getFirstChild() ) {
			RefBaseAST(sibling->getFirstChild())->doWorkForFindAll(v, target, partialMatch);
		}
	}
}